

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardGroup.cpp
# Opt level: O0

Card * __thiscall CardGroup::first(CardGroup *this)

{
  int iVar1;
  size_type sVar2;
  const_reference ppCVar3;
  int local_1c;
  int pos;
  CardGroup *this_local;
  
  iVar1 = this->top;
  sVar2 = std::vector<Card_*,_std::allocator<Card_*>_>::size(&this->cards);
  if ((ulong)(long)iVar1 < sVar2) {
    local_1c = this->top;
    do {
      ppCVar3 = std::vector<Card_*,_std::allocator<Card_*>_>::operator[]
                          (&this->cards,(long)local_1c);
      if (*ppCVar3 != (value_type)0x0) {
        ppCVar3 = std::vector<Card_*,_std::allocator<Card_*>_>::operator[]
                            (&this->cards,(long)local_1c);
        return *ppCVar3;
      }
      local_1c = local_1c + 1;
      sVar2 = std::vector<Card_*,_std::allocator<Card_*>_>::size(&this->cards);
    } while ((ulong)(long)local_1c < sVar2);
  }
  return (Card *)0x0;
}

Assistant:

Card * CardGroup::first() const {
        if(top >= this->cards.size()) return NULL;
        int pos = top;
        while(this->cards[pos] == NULL) {
                pos++;
                if(pos >= this->cards.size()) return NULL;
        }
        return this->cards[pos];
}